

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_4,_2> * tcu::operator*(Matrix<double,_4,_1> *a,Matrix<double,_1,_2> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int row;
  long lVar4;
  Matrix<double,_4,_2> *res;
  Matrix<double,_4,_2> *in_RDI;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 1.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined4 *)(in_RDI->m_data).m_data[1].m_data = 0;
  *(undefined4 *)((long)(in_RDI->m_data).m_data[1].m_data + 4) = 0;
  *(undefined4 *)((in_RDI->m_data).m_data[1].m_data + 1) = 0;
  *(undefined4 *)((long)(in_RDI->m_data).m_data[1].m_data + 0xc) = 0x3ff00000;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[3] = 0.0;
  dVar1 = (b->m_data).m_data[0].m_data[0];
  dVar2 = (b->m_data).m_data[1].m_data[0];
  lVar4 = 0;
  do {
    dVar3 = (a->m_data).m_data[0].m_data[lVar4];
    (in_RDI->m_data).m_data[0].m_data[lVar4] = dVar3 * dVar1 + 0.0;
    (in_RDI->m_data).m_data[1].m_data[lVar4] = dVar3 * dVar2 + 0.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}